

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall winmd::reader::table_base::set_data(table_base *this,byte_view *view)

{
  uint8_t *puVar1;
  byte_view local_28;
  byte_view *local_18;
  byte_view *view_local;
  table_base *this_local;
  
  if (this->m_row_count != 0) {
    local_18 = view;
    view_local = (byte_view *)this;
    puVar1 = byte_view::begin(view);
    this->m_data = puVar1;
    byte_view::seek(&local_28,(uint32_t)local_18);
    byte_view::operator=(local_18,&local_28);
  }
  return;
}

Assistant:

void set_data(byte_view& view) noexcept
        {
            XLANG_ASSERT(!m_data);

            if (m_row_count)
            {
                XLANG_ASSERT(m_row_size);
                m_data = view.begin();
                view = view.seek(m_row_count * m_row_size);
            }
        }